

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

JSON_Status json_array_append_string(JSON_Array *array,char *string)

{
  JSON_Status JVar1;
  JSON_Value *value;
  
  value = json_value_init_string(string);
  if (value != (JSON_Value *)0x0) {
    if (((array != (JSON_Array *)0x0) && (value->parent == (JSON_Value *)0x0)) &&
       (JVar1 = json_array_add(array,value), JVar1 == 0)) {
      return 0;
    }
    json_value_free(value);
  }
  return -1;
}

Assistant:

JSON_Status json_array_append_string(JSON_Array *array, const char *string) {
    JSON_Value *value = json_value_init_string(string);
    if (value == NULL) {
        return JSONFailure;
    }
    if (json_array_append_value(array, value) != JSONSuccess) {
        json_value_free(value);
        return JSONFailure;
    }
    return JSONSuccess;
}